

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9VmRegisterConstant(jx9_vm *pVm,SyString *pName,ProcConstant xExpand,void *pUserData)

{
  sxu32 nKeyLen;
  void *pvVar1;
  sxi32 sVar2;
  SyHashEntry *pSVar3;
  undefined8 *pChunk;
  char *pKey;
  sxi32 sVar4;
  
  pSVar3 = SyHashGet(&pVm->hConstant,pName->zString,pName->nByte);
  if (pSVar3 == (SyHashEntry *)0x0) {
    pChunk = (undefined8 *)SyMemBackendPoolAlloc(&pVm->sAllocator,0x20);
    sVar4 = 0;
    if (pChunk != (undefined8 *)0x0) {
      pKey = SyMemBackendStrDup(&pVm->sAllocator,pName->zString,pName->nByte);
      if (pKey == (char *)0x0) {
        SyMemBackendPoolFree(&pVm->sAllocator,pChunk);
      }
      else {
        *pChunk = pKey;
        nKeyLen = pName->nByte;
        *(sxu32 *)(pChunk + 1) = nKeyLen;
        pChunk[2] = xExpand;
        pChunk[3] = pUserData;
        sVar2 = SyHashInsert(&pVm->hConstant,pKey,nKeyLen,pChunk);
        if (sVar2 != 0) {
          SyMemBackendFree(&pVm->sAllocator,pKey);
          SyMemBackendPoolFree(&pVm->sAllocator,pChunk);
          sVar4 = -1;
        }
      }
    }
  }
  else {
    pvVar1 = pSVar3->pUserData;
    *(ProcConstant *)((long)pvVar1 + 0x10) = xExpand;
    *(void **)((long)pvVar1 + 0x18) = pUserData;
    sVar4 = 0;
  }
  return sVar4;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmRegisterConstant(
	jx9_vm *pVm,            /* Target VM */
	const SyString *pName,  /* Constant name */
	ProcConstant xExpand,   /* Constant expansion callback */
	void *pUserData         /* Last argument to xExpand() */
	)
{
	jx9_constant *pCons;
	SyHashEntry *pEntry;
	char *zDupName;
	sxi32 rc;
	pEntry = SyHashGet(&pVm->hConstant, (const void *)pName->zString, pName->nByte);
	if( pEntry ){
		/* Overwrite the old definition and return immediately */
		pCons = (jx9_constant *)pEntry->pUserData;
		pCons->xExpand = xExpand;
		pCons->pUserData = pUserData;
		return SXRET_OK;
	}
	/* Allocate a new constant instance */
	pCons = (jx9_constant *)SyMemBackendPoolAlloc(&pVm->sAllocator, sizeof(jx9_constant));
	if( pCons == 0 ){
		return 0;
	}
	/* Duplicate constant name */
	zDupName = SyMemBackendStrDup(&pVm->sAllocator, pName->zString, pName->nByte);
	if( zDupName == 0 ){
		SyMemBackendPoolFree(&pVm->sAllocator, pCons);
		return 0;
	}
	/* Install the constant */
	SyStringInitFromBuf(&pCons->sName, zDupName, pName->nByte);
	pCons->xExpand = xExpand;
	pCons->pUserData = pUserData;
	rc = SyHashInsert(&pVm->hConstant, (const void *)zDupName, SyStringLength(&pCons->sName), pCons);
	if( rc != SXRET_OK ){
		SyMemBackendFree(&pVm->sAllocator, zDupName);
		SyMemBackendPoolFree(&pVm->sAllocator, pCons);
		return rc;
	}
	/* All done, constant can be invoked from JX9 code */
	return SXRET_OK;
}